

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O1

QDate __thiscall
QtPrivate::QCalendarYearValidator::applyToDate
          (undefined8 param_1,undefined8 param_2,undefined8 param_3)

{
  int extraout_var;
  qint64 qVar1;
  long in_FS_OFFSET;
  undefined1 local_20 [16];
  
  local_20._8_8_ = *(long *)(in_FS_OFFSET + 0x28);
  local_20._0_8_ = param_3;
  QCalendar::partsFromDate((QDate)local_20);
  QCalendar::daysInMonth((int)(YearMonthDay *)local_20,extraout_var);
  qVar1 = QCalendar::dateFromParts((YearMonthDay *)local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20._8_8_) {
    __stack_chk_fail();
  }
  return (QDate)qVar1;
}

Assistant:

QDate QCalendarYearValidator::applyToDate(QDate date, QCalendar cal) const
{
    auto parts = cal.partsFromDate(date);
    if (!parts.isValid())
        return QDate();
    // This widget does not support negative years (some calendars may support)
    parts.year = qMax(1, m_year);
    parts.day = qMin(parts.day, cal.daysInMonth(parts.month, parts.year));
    return cal.dateFromParts(parts);
}